

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitTriangleMesh(SemanticParser *this,SP *shape)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  SP SVar4;
  vec3f vVar5;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> alphaParam;
  vec3f *v_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1_1;
  vec3f *v;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *__range1;
  affine3f xfm;
  SP ours;
  undefined4 in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffc9c;
  shared_ptr<pbrt::Shape> *in_stack_fffffffffffffca0;
  ParamArray<float> *this_00;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *in_stack_fffffffffffffca8;
  allocator *paVar6;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *in_stack_fffffffffffffcb0;
  vec3f *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  float in_stack_fffffffffffffcc4;
  ParamSet *this_01;
  undefined1 in_stack_fffffffffffffcc8 [16];
  undefined1 in_stack_fffffffffffffce8 [16];
  SemanticParser *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd18;
  SP *in_stack_fffffffffffffd20;
  SP *shape_00;
  SemanticParser *in_stack_fffffffffffffd28;
  SemanticParser *this_02;
  SP *in_stack_fffffffffffffd60;
  SP *in_stack_fffffffffffffd68;
  SemanticParser *in_stack_fffffffffffffd70;
  __shared_ptr local_278 [48];
  undefined8 local_248;
  float local_240;
  undefined8 local_234;
  float local_22c;
  reference local_228;
  vec3f *local_220;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_218;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f4;
  float local_1ec;
  reference local_1e8;
  vec3f *local_1e0;
  __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
  local_1d8;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_1d0;
  undefined1 local_1c4 [51];
  allocator local_191;
  string local_190 [79];
  allocator local_141;
  string local_140 [79];
  undefined1 local_f1 [80];
  allocator local_a1;
  string local_a0 [48];
  SP local_70 [7];
  
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1da91a);
  std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::syntactic::Material> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  findOrCreateMaterial(in_stack_fffffffffffffcf8,in_stack_fffffffffffffce8._8_8_);
  std::make_shared<pbrt::TriangleMesh,std::shared_ptr<pbrt::Material>>
            (in_stack_fffffffffffffcc8._0_8_);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x1da979);
  std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)0x1da986);
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::syntactic::Shape> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"P",&local_a1);
  extractVector<pbrt::math::vec3f>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1daa02);
  shape_00 = local_70;
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffcb0,
             (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffca8);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::~vector
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1daa52);
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::syntactic::Shape> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  this_02 = (SemanticParser *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f1 + 1),"N",(allocator *)this_02);
  extractVector<pbrt::math::vec3f>(this_02,shape_00,in_stack_fffffffffffffd18);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1daace);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffcb0,
             (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffca8);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::~vector
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
             in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1dab1b);
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::syntactic::Shape> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  paVar6 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"uv",paVar6);
  extractVector<pbrt::math::vec2f>(this_02,shape_00,(string *)paVar6);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1dab97);
  std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::operator=
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::~vector
            (in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1dabe4);
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::syntactic::Shape> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"indices",&local_191);
  extractVector<pbrt::math::vec3i>(this_02,shape_00,(string *)paVar6);
  std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1dac5a);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::operator=
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
             in_stack_fffffffffffffcb0,
             (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
             in_stack_fffffffffffffca8);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::~vector
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
             in_stack_fffffffffffffcb0);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1daca5);
  peVar2 = std::
           __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1dacb2);
  memcpy(local_1c4,&peVar2->transform,0x30);
  peVar3 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1dacd8);
  local_1d0 = &peVar3->vertex;
  local_1d8._M_current =
       (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                          ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_1e0 = (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end
                                 ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                             *)in_stack_fffffffffffffca0,
                            (__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)), bVar1
        ) {
    local_1e8 = __gnu_cxx::
                __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                ::operator*(&local_1d8);
    vVar5 = math::xfmPoint((affine3f *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0)
                           ,in_stack_fffffffffffffcb8);
    local_200 = vVar5.z;
    local_208 = vVar5._0_8_;
    in_stack_fffffffffffffce8._8_4_ = extraout_XMM0_Dc;
    in_stack_fffffffffffffce8._0_8_ = local_208;
    in_stack_fffffffffffffce8._12_4_ = extraout_XMM0_Dd;
    local_1e8->x = (float)(int)local_208;
    local_1e8->y = (float)(int)((ulong)local_208 >> 0x20);
    local_1e8->z = local_200;
    local_1f4 = local_208;
    local_1ec = local_200;
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++(&local_1d8);
  }
  peVar3 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1daf94);
  local_210 = &peVar3->normal;
  local_218._M_current =
       (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::begin
                          ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_220 = (vec3f *)std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::end
                                 ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while( true ) {
    this_01 = in_stack_fffffffffffffcc8._0_8_;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)in_stack_fffffffffffffca0,
                       (__normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    if (!bVar1) break;
    local_228 = __gnu_cxx::
                __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
                ::operator*(&local_218);
    vVar5 = math::xfmNormal(in_stack_fffffffffffffce8._8_8_,in_stack_fffffffffffffce8._0_8_);
    in_stack_fffffffffffffcc4 = vVar5.z;
    local_248 = vVar5._0_8_;
    in_stack_fffffffffffffcc8._8_4_ = extraout_XMM0_Dc_00;
    in_stack_fffffffffffffcc8._0_8_ = local_248;
    in_stack_fffffffffffffcc8._12_4_ = extraout_XMM0_Dd_00;
    local_228->x = (float)(int)local_248;
    local_228->y = (float)(int)((ulong)local_248 >> 0x20);
    local_228->z = in_stack_fffffffffffffcc4;
    local_240 = in_stack_fffffffffffffcc4;
    local_234 = local_248;
    local_22c = in_stack_fffffffffffffcc4;
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec3f_*,_std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>_>
    ::operator++(&local_218);
  }
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::TriangleMesh,void>
            (in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::TriangleMesh> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffca0,
             (shared_ptr<pbrt::syntactic::Shape> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  extractTextures(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1db0e5);
  std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x1db0f2);
  peVar2 = std::
           __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1db0ff);
  this_00 = (ParamArray<float> *)&(peVar2->super_Node).super_ParamSet;
  paVar6 = (allocator *)&stack0xfffffffffffffd67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd68,"alpha",paVar6);
  syntactic::ParamSet::findParam<float>
            (this_01,(string *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd67);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_278);
  if (bVar1) {
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1db18e);
    in_stack_fffffffffffffc9c =
         syntactic::ParamArray<float>::get
                   (this_00,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    peVar3 = std::__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1db1af);
    (peVar3->super_Shape).alpha = in_stack_fffffffffffffc9c;
  }
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::TriangleMesh,void>
            ((shared_ptr<pbrt::Shape> *)this_00,
             (shared_ptr<pbrt::TriangleMesh> *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x1db27d);
  std::shared_ptr<pbrt::TriangleMesh>::~shared_ptr((shared_ptr<pbrt::TriangleMesh> *)0x1db28a);
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitTriangleMesh(pbrt::syntactic::Shape::SP shape)
  {
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));

    // vertices - param "P", 3x float each
    ours->vertex = extractVector<vec3f>(shape,"P");
    // vertex normals - param "N", 3x float each
    ours->normal = extractVector<vec3f>(shape,"N");
    // per-vertex texture coordinates - param "uv", 2x float each
    ours->texcoord = extractVector<vec2f>(shape,"uv");
    // triangle vertex indices - param "indices", 3x int each
    ours->index = extractVector<vec3i>(shape,"indices");

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);
    extractTextures(ours,shape);
    
    auto alphaParam = shape->findParam<float>("alpha");
    if (alphaParam) 
      ours->alpha = alphaParam->get(0);
    
    return ours;
  }